

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

MaxBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_maxbroadcastable(NeuralNetworkLayer *this)

{
  bool bVar1;
  MaxBroadcastableLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_maxbroadcastable(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_maxbroadcastable(this);
    this_00 = (MaxBroadcastableLayerParams *)operator_new(0x18);
    MaxBroadcastableLayerParams::MaxBroadcastableLayerParams(this_00);
    (this->layer_).maxbroadcastable_ = this_00;
  }
  return (MaxBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::MaxBroadcastableLayerParams* NeuralNetworkLayer::mutable_maxbroadcastable() {
  if (!has_maxbroadcastable()) {
    clear_layer();
    set_has_maxbroadcastable();
    layer_.maxbroadcastable_ = new ::CoreML::Specification::MaxBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.maxBroadcastable)
  return layer_.maxbroadcastable_;
}